

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

int despot::Variable::ComputeCurrentIndex
              (vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *vars)

{
  value_type this;
  int iVar1;
  size_type sVar2;
  const_reference ppNVar3;
  NamedVar *var;
  int i;
  int index;
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *vars_local;
  
  var._4_4_ = 0;
  var._0_4_ = 0;
  while( true ) {
    sVar2 = std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::size(vars);
    if (sVar2 <= (ulong)(long)(int)var) break;
    ppNVar3 = std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::operator[]
                        (vars,(long)(int)var);
    this = *ppNVar3;
    iVar1 = Size(&this->super_Variable);
    var._4_4_ = var._4_4_ * iVar1 + (this->super_Variable).curr_value;
    var._0_4_ = (int)var + 1;
  }
  return var._4_4_;
}

Assistant:

int Variable::ComputeCurrentIndex(const vector<NamedVar*>& vars) {
	int index = 0;
	for (int i = 0; i < vars.size(); i++) {
		NamedVar* var = vars[i];
		index = index * var->Size() + var->curr_value;
	}
	return index;
}